

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char  [7] __thiscall kj::str<unsigned_int>(kj *this,StringPtr *params)

{
  char (*result) [7];
  void *__dest;
  CappedArray<char,_14UL> local_28;
  
  _::Stringifier::operator*(&local_28,(Stringifier *)&_::STR,*(uint *)&(params->content).ptr);
  heapString((String *)this,local_28.currentSize);
  if (local_28.currentSize != 0) {
    __dest = *(void **)(this + 8);
    if (__dest != (void *)0x0) {
      __dest = *(void **)this;
    }
    memcpy(__dest,local_28.content,local_28.currentSize);
  }
  return SUB87(this,0);
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}